

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void Mahony_update(quaternion *q)

{
  float afVar1 [1];
  float fVar2;
  float fVar3;
  float fVar4;
  size_t m;
  long lVar5;
  float sum;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  matrix<3UL,_1UL> result;
  vector<3UL> gyr;
  matrix<3UL,_1UL> result_6;
  quaternion qStack_118;
  quaternion local_100;
  float local_e8 [2];
  undefined8 uStack_e0;
  float fStack_d8;
  float afStack_c8 [2];
  undefined8 local_c0;
  float local_b8;
  float afStack_b0 [2];
  undefined8 local_a8;
  float local_a0;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  
  physical_model::accelerometer();
  fVar6 = 0.0;
  lVar5 = 2;
  do {
    afVar1[0] = local_100.data.super_matrix<4UL,_1UL>.data[lVar5 + -2][0];
    fVar6 = fVar6 + afVar1[0] * afVar1[0];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  qStack_118.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  qStack_118.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  qStack_118.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  lVar5 = 2;
  do {
    qStack_118.data.super_matrix<4UL,_1UL>.data[lVar5 + -2][0] =
         local_100.data.super_matrix<4UL,_1UL>.data[lVar5 + -2][0] * (1.0 / fVar6);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  local_38 = ZEXT416((uint)qStack_118.data.super_matrix<4UL,_1UL>.data[0][0]);
  local_48 = CONCAT44(qStack_118.data.super_matrix<4UL,_1UL>.data[2][0],
                      qStack_118.data.super_matrix<4UL,_1UL>.data[1][0]);
  uStack_40 = 0;
  local_100.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_100.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  local_100.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00106d40;
  local_100.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  local_100.data.super_matrix<4UL,_1UL>.data[3][0] = 1.0;
  blas::quaternion::rotate_inv(&qStack_118,q,&local_100);
  local_58 = ZEXT416((uint)qStack_118.data.super_matrix<4UL,_1UL>.data[1][0]);
  local_68 = CONCAT44(qStack_118.data.super_matrix<4UL,_1UL>.data[3][0],
                      qStack_118.data.super_matrix<4UL,_1UL>.data[2][0]);
  uStack_60 = 0;
  physical_model::magnetometer();
  fVar6 = 0.0;
  lVar5 = 2;
  do {
    afVar1[0] = local_100.data.super_matrix<4UL,_1UL>.data[lVar5 + -2][0];
    fVar6 = fVar6 + afVar1[0] * afVar1[0];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  qStack_118.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  qStack_118.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  qStack_118.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  lVar5 = 2;
  do {
    qStack_118.data.super_matrix<4UL,_1UL>.data[lVar5 + -2][0] =
         local_100.data.super_matrix<4UL,_1UL>.data[lVar5 + -2][0] * (1.0 / fVar6);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  local_98 = ZEXT416((uint)qStack_118.data.super_matrix<4UL,_1UL>.data[2][0]);
  local_88 = qStack_118.data.super_matrix<4UL,_1UL>.data[0][0];
  fStack_84 = qStack_118.data.super_matrix<4UL,_1UL>.data[1][0];
  uStack_80 = 0;
  local_78 = qStack_118.data.super_matrix<4UL,_1UL>.data[1][0];
  fStack_74 = qStack_118.data.super_matrix<4UL,_1UL>.data[2][0];
  uStack_70 = 0;
  local_100.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_100.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00106d40;
  local_100.data.super_matrix<4UL,_1UL>.data[1][0] =
       qStack_118.data.super_matrix<4UL,_1UL>.data[0][0];
  local_100.data.super_matrix<4UL,_1UL>.data[2][0] =
       qStack_118.data.super_matrix<4UL,_1UL>.data[1][0];
  local_100.data.super_matrix<4UL,_1UL>.data[3][0] =
       qStack_118.data.super_matrix<4UL,_1UL>.data[2][0];
  blas::quaternion::rotate(&qStack_118,q,&local_100);
  local_100.data.super_matrix<4UL,_1UL>.data[1][0] =
       SQRT(qStack_118.data.super_matrix<4UL,_1UL>.data[1][0] *
            qStack_118.data.super_matrix<4UL,_1UL>.data[1][0] +
            qStack_118.data.super_matrix<4UL,_1UL>.data[2][0] *
            qStack_118.data.super_matrix<4UL,_1UL>.data[2][0]);
  local_100.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  local_100.data.super_matrix<4UL,_1UL>._vptr_matrix =
       (_func_int **)&PTR_to_string_abi_cxx11__00106d40;
  local_100.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  local_100.data.super_matrix<4UL,_1UL>.data[3][0] =
       qStack_118.data.super_matrix<4UL,_1UL>.data[3][0];
  blas::quaternion::rotate_inv(&qStack_118,q,&local_100);
  uStack_e0 = CONCAT44((float)local_58._0_4_ * local_48._4_4_ -
                       (float)local_38._0_4_ * local_68._4_4_,
                       local_68._4_4_ * (float)local_48 - local_48._4_4_ * (float)local_68);
  fStack_d8 = (float)local_38._0_4_ * (float)local_68 - (float)local_58._0_4_ * (float)local_48;
  local_c0 = CONCAT44(qStack_118.data.super_matrix<4UL,_1UL>.data[1][0] * fStack_74 -
                      local_88 * qStack_118.data.super_matrix<4UL,_1UL>.data[3][0],
                      qStack_118.data.super_matrix<4UL,_1UL>.data[3][0] * local_78 -
                      (float)local_98._0_4_ * qStack_118.data.super_matrix<4UL,_1UL>.data[2][0]);
  local_b8 = qStack_118.data.super_matrix<4UL,_1UL>.data[2][0] * local_88 -
             fStack_84 * qStack_118.data.super_matrix<4UL,_1UL>.data[1][0];
  qStack_118.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  qStack_118.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  qStack_118.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  lVar5 = 2;
  do {
    qStack_118.data.super_matrix<4UL,_1UL>.data[lVar5 + -2][0] = local_e8[lVar5] + afStack_c8[lVar5]
    ;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  local_100.data.super_matrix<4UL,_1UL>.data[2][0] =
       qStack_118.data.super_matrix<4UL,_1UL>.data[2][0];
  local_100.data.super_matrix<4UL,_1UL>.data[0][0] =
       qStack_118.data.super_matrix<4UL,_1UL>.data[0][0];
  local_100.data.super_matrix<4UL,_1UL>.data[1][0] =
       qStack_118.data.super_matrix<4UL,_1UL>.data[1][0];
  physical_model::gyroscope();
  qStack_118.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  qStack_118.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  qStack_118.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  lVar5 = 2;
  do {
    qStack_118.data.super_matrix<4UL,_1UL>.data[lVar5 + -2][0] =
         local_100.data.super_matrix<4UL,_1UL>.data[lVar5 + -2][0] * 0.02;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  local_a0 = qStack_118.data.super_matrix<4UL,_1UL>.data[2][0];
  local_a8 = CONCAT44(qStack_118.data.super_matrix<4UL,_1UL>.data[1][0],
                      qStack_118.data.super_matrix<4UL,_1UL>.data[0][0]);
  qStack_118.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  qStack_118.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  qStack_118.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  lVar5 = 2;
  do {
    qStack_118.data.super_matrix<4UL,_1UL>.data[lVar5 + -2][0] = afStack_b0[lVar5] * 0.01;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  local_b8 = qStack_118.data.super_matrix<4UL,_1UL>.data[2][0];
  local_c0 = CONCAT44(qStack_118.data.super_matrix<4UL,_1UL>.data[1][0],
                      qStack_118.data.super_matrix<4UL,_1UL>.data[0][0]);
  lVar5 = 2;
  do {
    Mahony_update::integrated_error.super_matrix<3UL,_1UL>.data[lVar5 + -2][0] =
         afStack_c8[lVar5] +
         Mahony_update::integrated_error.super_matrix<3UL,_1UL>.data[lVar5 + -2][0];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  qStack_118.data.super_matrix<4UL,_1UL>.data[2][0] = 0.0;
  qStack_118.data.super_matrix<4UL,_1UL>.data[0][0] = 0.0;
  qStack_118.data.super_matrix<4UL,_1UL>.data[1][0] = 0.0;
  lVar5 = 2;
  do {
    qStack_118.data.super_matrix<4UL,_1UL>.data[lVar5 + -2][0] =
         local_100.data.super_matrix<4UL,_1UL>.data[lVar5 + -2][0] * 120.0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  local_a0 = qStack_118.data.super_matrix<4UL,_1UL>.data[2][0];
  local_a8 = CONCAT44(qStack_118.data.super_matrix<4UL,_1UL>.data[1][0],
                      qStack_118.data.super_matrix<4UL,_1UL>.data[0][0]);
  local_c0 = 0;
  local_b8 = 0.0;
  lVar5 = 2;
  do {
    afStack_c8[lVar5] =
         Mahony_update::integrated_error.super_matrix<3UL,_1UL>.data[lVar5 + -2][0] +
         afStack_b0[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  qStack_118.data.super_matrix<4UL,_1UL>.data[2][0] = local_b8;
  qStack_118.data.super_matrix<4UL,_1UL>.data[0][0] = (float)local_c0;
  qStack_118.data.super_matrix<4UL,_1UL>.data[1][0] = (float)((ulong)local_c0 >> 0x20);
  lVar5 = 2;
  do {
    local_e8[lVar5] = qStack_118.data.super_matrix<4UL,_1UL>.data[lVar5 + -2][0] + local_e8[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  fVar6 = (q->data).super_matrix<4UL,_1UL>.data[0][0];
  fVar2 = (q->data).super_matrix<4UL,_1UL>.data[1][0];
  fVar3 = (q->data).super_matrix<4UL,_1UL>.data[2][0];
  fVar4 = (q->data).super_matrix<4UL,_1UL>.data[3][0];
  fVar7 = fVar6 * 0.5;
  fVar8 = fVar2 * 0.5;
  fVar9 = fVar3 * 0.5;
  fVar10 = fVar4 * 0.5;
  (q->data).super_matrix<4UL,_1UL>.data[0][0] =
       (fStack_d8 * -fVar10 + uStack_e0._4_4_ * -fVar9 + fVar7 * 0.0 + -fVar8 * (float)uStack_e0) *
       0.01 + fVar6;
  (q->data).super_matrix<4UL,_1UL>.data[1][0] =
       (fStack_d8 * fVar9 + uStack_e0._4_4_ * -fVar10 + fVar8 * 0.0 + fVar7 * (float)uStack_e0) *
       0.01 + fVar2;
  (q->data).super_matrix<4UL,_1UL>.data[2][0] =
       (fStack_d8 * -fVar8 + uStack_e0._4_4_ * fVar7 + fVar9 * 0.0 + fVar10 * (float)uStack_e0) *
       0.01 + fVar3;
  (q->data).super_matrix<4UL,_1UL>.data[3][0] =
       (fStack_d8 * fVar7 + uStack_e0._4_4_ * fVar8 + fVar10 * 0.0 + -fVar9 * (float)uStack_e0) *
       0.01 + fVar4;
  fVar6 = 0.0;
  lVar5 = 0;
  do {
    fVar2 = (q->data).super_matrix<4UL,_1UL>.data[lVar5][0];
    fVar6 = fVar6 + fVar2 * fVar2;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  fVar6 = 1.0 / fVar6;
  fVar2 = (q->data).super_matrix<4UL,_1UL>.data[1][0];
  fVar3 = (q->data).super_matrix<4UL,_1UL>.data[2][0];
  fVar4 = (q->data).super_matrix<4UL,_1UL>.data[3][0];
  (q->data).super_matrix<4UL,_1UL>.data[0][0] = (q->data).super_matrix<4UL,_1UL>.data[0][0] * fVar6;
  (q->data).super_matrix<4UL,_1UL>.data[1][0] = fVar2 * fVar6;
  (q->data).super_matrix<4UL,_1UL>.data[2][0] = fVar3 * fVar6;
  (q->data).super_matrix<4UL,_1UL>.data[3][0] = fVar4 * fVar6;
  return;
}

Assistant:

void Mahony_update(blas::quaternion &q) {
    using blas::quaternion;
    using blas::vector;
    using blas::matrix;

    const float Kp = 120.0, Ki = 0.02;
    static vector<3> integrated_error;

    const vector<3> acc = physical_model::accelerometer().normalized();
    // Assume the real acceleration is pointing to z+,
    // i.e. there is no accelerated motion.
    const vector<3> acc_expect = q.rotate_inv({0, 0, 1});

    const vector<3> mag = physical_model::magnetometer().normalized();
    const vector<3> mag_0 = q.rotate(mag);
    // Decompose into x-y plane(horizontal) and z-axis(vertical).
    const float mag_h = sqrtf(mag_0(0) * mag_0(0) + mag_0(1) * mag_0(1));
    const float mag_v = mag_0(2);
    // Assume the real direction of magnetic field is in surface y=0, pointing to x+,
    // i.e. there is no electromagnetic interference.
    const vector<3> mag_expect = q.rotate_inv({mag_h, 0, mag_v});

    const vector<3> error = acc.cross(acc_expect) + mag.cross(mag_expect);

    vector<3> gyr = physical_model::gyroscope();
    integrated_error += Ki * error * duration;
    gyr += integrated_error + Kp * error;

    // Approximate the integral
    q += 0.5 * q * gyr * duration;
    q = q.normalized();
}